

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

uint32_t __thiscall Jinx::Impl::Parser::ParseSubscriptSet(Parser *this)

{
  bool bVar1;
  bool local_25;
  uint32_t local_24;
  const_iterator cStack_20;
  uint32_t count;
  Parser *local_18;
  Parser *this_local;
  
  local_25 = true;
  local_18 = this;
  if ((this->m_error & 1U) == 0) {
    cStack_20 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                          (this->m_symbolList);
    local_25 = __gnu_cxx::operator==(&this->m_currentSymbol,&stack0xffffffffffffffe0);
  }
  if (local_25 == false) {
    local_24 = 0;
    while( true ) {
      bVar1 = Accept(this,SquareOpen);
      if (!bVar1) break;
      ParseExpression(this);
      Expect(this,SquareClose,(char *)0x0);
      local_24 = local_24 + 1;
    }
    this_local._4_4_ = local_24;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

inline_t uint32_t Parser::ParseSubscriptSet()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return 0;
		uint32_t count = 0;
		while (Accept(SymbolType::SquareOpen))
		{
			ParseExpression();
			Expect(SymbolType::SquareClose);
			++count;
		}
		return count;
	}